

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

Value * minja::Value::callable(CallableType *callable)

{
  Value *in_RDI;
  shared_ptr<std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>_>
  *in_stack_ffffffffffffffd8;
  Value *in_stack_ffffffffffffffe0;
  function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>
  *in_stack_ffffffffffffffe8;
  
  std::
  make_shared<std::function<minja::Value(std::shared_ptr<minja::Context>const&,minja::ArgumentsValue&)>,std::function<minja::Value(std::shared_ptr<minja::Context>const&,minja::ArgumentsValue&)>const&>
            (in_stack_ffffffffffffffe8);
  Value(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::
  shared_ptr<std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>_>
  ::~shared_ptr((shared_ptr<std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>_>
                 *)0x294a29);
  return in_RDI;
}

Assistant:

static Value callable(const CallableType & callable) {
    return Value(std::make_shared<CallableType>(callable));
  }